

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

bool baryonyx::is_valid_solution(raw_problem *pb,result *r)

{
  result *pb_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference this;
  vector<signed_char,_std::allocator<signed_char>_> local_38;
  result *local_20;
  result *r_local;
  raw_problem *pb_local;
  
  local_20 = r;
  r_local = (result *)pb;
  bVar1 = result::operator_cast_to_bool(r);
  if ((!bVar1) ||
     (bVar1 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::empty
                        (&local_20->solutions), bVar1)) {
    pb_local._7_1_ = 0;
  }
  else {
    sVar2 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&r_local->variables);
    sVar3 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::size
                      ((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                        *)(r_local + 1));
    if (sVar2 != sVar3) {
      details::fail_fast("Precondition","pb.vars.names.size() == pb.vars.values.size()",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"239");
    }
    sVar2 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&r_local->variables);
    sVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size(&local_20->variable_name);
    sVar4 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size(&(local_20->affected_vars).names);
    if (sVar2 != sVar3 + sVar4) {
      details::fail_fast("Precondition",
                         "pb.vars.names.size() == r.variable_name.size() + r.affected_vars.names.size()"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"241");
    }
    this = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                     (&local_20->solutions);
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&this->variables);
    sVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size(&local_20->variable_name);
    pb_00 = r_local;
    if (sVar2 != sVar3) {
      details::fail_fast("Precondition",
                         "r.solutions.back().variables.size() == r.variable_name.size()",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"242");
    }
    make_variable_value<baryonyx::raw_problem>(&local_38,(raw_problem *)r_local,local_20);
    pb_local._7_1_ = is_valid_solution_impl((raw_problem *)pb_00,&local_38);
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&local_38);
  }
  return (bool)(pb_local._7_1_ & 1);
}

Assistant:

bool
is_valid_solution(const raw_problem& pb, const result& r)
{
    if (!r || r.solutions.empty())
        return false;

    bx_expects(pb.vars.names.size() == pb.vars.values.size());
    bx_expects(pb.vars.names.size() ==
               r.variable_name.size() + r.affected_vars.names.size());
    bx_expects(r.solutions.back().variables.size() == r.variable_name.size());

    return is_valid_solution_impl(pb, make_variable_value(pb, r));
}